

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::parsePseudoShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,int type)

{
  bool bVar1;
  Token *pTVar2;
  int type_local;
  ArmOpcodeVariables *vars_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  (vars->Shift).Type = (uchar)type;
  bVar1 = parseRegister(this,parser,&(vars->Shift).reg,0xf);
  if (bVar1) {
    (vars->Shift).ShiftByRegister = true;
  }
  else {
    pTVar2 = Parser::peekToken(parser,0);
    if (pTVar2->type == Hash) {
      Parser::eatToken(parser);
    }
    bVar1 = parseImmediate(this,parser,&(vars->Shift).ShiftExpression);
    if (!bVar1) {
      return false;
    }
    (vars->Shift).ShiftByRegister = false;
  }
  (vars->Shift).UseShift = true;
  return true;
}

Assistant:

bool ArmParser::parsePseudoShift(Parser& parser, ArmOpcodeVariables& vars, int type)
{
	vars.Shift.Type = type;

	if (parseRegister(parser,vars.Shift.reg))
	{
		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}